

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  int iVar1;
  uint64_t uVar2;
  void *pvVar3;
  uint64_t uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  Result *_result;
  undefined1 *puVar8;
  long lVar9;
  undefined1 *puVar10;
  InternalMetadata *pIVar11;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string *local_c8;
  char local_b9;
  string err;
  string local_90;
  uint64_t local_70;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,2,2);
  bVar6 = Result::good(__return_storage_ptr__);
  if (!bVar6) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GRU",(allocator<char> *)&err);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_50);
    bVar6 = Result::good(__return_storage_ptr__);
    if (!bVar6) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"GRU",(allocator<char> *)&local_90);
    validateRankCount(__return_storage_ptr__,layer,&err,5,5,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&err);
    bVar6 = Result::good(__return_storage_ptr__);
    if (!bVar6) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0x19a) {
    puVar10 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar10 = Specification::_GRULayerParams_default_instance_;
  }
  bVar6 = ((GRULayerParams *)puVar10)->hasbiasvectors_;
  weightTypeList.
  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  weightTypeList.
  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  weightTypeList.
  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar8 = (undefined1 *)((BatchnormLayerParams *)puVar10)->variance_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  puVar8 = (undefined1 *)((ScaleLayerParams *)puVar10)->scale_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->resetgateweightmatrix_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  puVar8 = (undefined1 *)((ScaleLayerParams *)puVar10)->bias_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgateweightmatrix_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgaterecursionmatrix_;
  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
    puVar8 = Specification::_WeightParams_default_instance_;
  }
  err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  if (bVar6 != false) {
    puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->updategatebiasvector_;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
    puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->resetgatebiasvector_;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
    puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgatebiasvector_;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = Specification::_WeightParams_default_instance_;
    }
    err._M_dataplus._M_p._0_4_ = valueType((WeightParams *)puVar8);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    emplace_back<CoreML::WeightParamType>(&weightTypeList,(WeightParamType *)&err);
  }
  bVar7 = isWeightParamTypeCompatible(&weightTypeList);
  if (bVar7) {
    puVar8 = (undefined1 *)((BatchnormLayerParams *)puVar10)->variance_;
    uVar2 = ((GRULayerParams *)puVar10)->outputvectorsize_;
    if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
      puVar8 = Specification::_WeightParams_default_instance_;
    }
    local_70 = ((GRULayerParams *)puVar10)->inputvectorsize_ * uVar2;
    local_c8 = (string *)this_00;
    local_b9 = bVar6;
    std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
    pvVar3 = (layer->name_).tagged_ptr_.ptr_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"update gate weight matrix",&local_ca);
    validateGeneralWeightParams
              (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
               (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&err);
    bVar6 = Result::good(__return_storage_ptr__);
    if (bVar6) {
      std::__cxx11::string::~string(local_c8);
      puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->resetgateweightmatrix_;
      if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
        puVar8 = Specification::_WeightParams_default_instance_;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
      pvVar3 = (layer->name_).tagged_ptr_.ptr_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"reset gate weight matrix",&local_ca);
      validateGeneralWeightParams
                (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
                 (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&err);
      bVar6 = Result::good(__return_storage_ptr__);
      if (bVar6) {
        std::__cxx11::string::~string(local_c8);
        puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgateweightmatrix_;
        if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
          puVar8 = Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
        pvVar3 = (layer->name_).tagged_ptr_.ptr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"output gate weight matrix",&local_ca);
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
                   (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&err);
        bVar6 = Result::good(__return_storage_ptr__);
        if (bVar6) {
          std::__cxx11::string::~string(local_c8);
          puVar8 = (undefined1 *)((ScaleLayerParams *)puVar10)->scale_;
          if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
            puVar8 = Specification::_WeightParams_default_instance_;
          }
          uVar4 = ((GRULayerParams *)puVar10)->outputvectorsize_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
          pvVar3 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"update gate recursion matrix",&local_ca);
          local_70 = uVar4 * uVar4;
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
                     (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&err);
          bVar6 = Result::good(__return_storage_ptr__);
          if (bVar6) {
            std::__cxx11::string::~string(local_c8);
            puVar8 = (undefined1 *)((ScaleLayerParams *)puVar10)->bias_;
            if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
              puVar8 = Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
            pvVar3 = (layer->name_).tagged_ptr_.ptr_;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"reset gate recursion matrix",&local_ca);
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
                       (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&err);
            bVar6 = Result::good(__return_storage_ptr__);
            if (bVar6) {
              std::__cxx11::string::~string(local_c8);
              puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgaterecursionmatrix_;
              if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                puVar8 = Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9);
              pvVar3 = (layer->name_).tagged_ptr_.ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_90,"output gate recursion matrix",&local_ca);
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar8,local_70,uVar2,&err,
                         (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&err);
              bVar6 = Result::good(__return_storage_ptr__);
              cVar5 = local_b9;
              if (bVar6) {
                std::__cxx11::string::~string(local_c8);
                if (cVar5 != '\0') {
                  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->updategatebiasvector_;
                  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                    puVar8 = Specification::_WeightParams_default_instance_;
                  }
                  uVar2 = ((GRULayerParams *)puVar10)->outputvectorsize_;
                  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9)
                  ;
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,"update gate bias vector",&local_ca);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar8,uVar2,1,&err,
                             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
                  std::__cxx11::string::~string((string *)&local_90);
                  std::__cxx11::string::~string((string *)&err);
                  bVar6 = Result::good(__return_storage_ptr__);
                  if (!bVar6) goto LAB_002a7334;
                  std::__cxx11::string::~string(local_c8);
                  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->resetgatebiasvector_;
                  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                    puVar8 = Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9)
                  ;
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,"reset gate bias vector",&local_ca);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar8,uVar2,1,&err,
                             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
                  std::__cxx11::string::~string((string *)&local_90);
                  std::__cxx11::string::~string((string *)&err);
                  bVar6 = Result::good(__return_storage_ptr__);
                  if (!bVar6) goto LAB_002a7334;
                  std::__cxx11::string::~string(local_c8);
                  puVar8 = (undefined1 *)((GRULayerParams *)puVar10)->outputgatebiasvector_;
                  if ((WeightParams *)puVar8 == (WeightParams *)0x0) {
                    puVar8 = Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"GRU",&local_c9)
                  ;
                  pvVar3 = (layer->name_).tagged_ptr_.ptr_;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_90,"output gate bias vector",&local_ca);
                  validateGeneralWeightParams
                            (__return_storage_ptr__,(WeightParams *)puVar8,uVar2,1,&err,
                             (string *)((ulong)pvVar3 & 0xfffffffffffffffe),&local_90);
                  std::__cxx11::string::~string((string *)&local_90);
                  std::__cxx11::string::~string((string *)&err);
                  bVar6 = Result::good(__return_storage_ptr__);
                  if (!bVar6) goto LAB_002a7334;
                  std::__cxx11::string::~string(local_c8);
                }
                pIVar11 = &(((BatchnormLayerParams *)puVar10)->mean_->super_MessageLite).
                           _internal_metadata_;
                if (((BatchnormLayerParams *)puVar10)->mean_ == (WeightParams *)0x0) {
                  pIVar11 = (InternalMetadata *)0x0;
                }
                iVar1 = *(int *)&(((ConvolutionLayerParams *)puVar10)->kernelsize_).
                                 arena_or_elements_;
                for (lVar9 = 0; (long)iVar1 * 8 != lVar9; lVar9 = lVar9 + 8) {
                  validateRecurrentActivationParams
                            (__return_storage_ptr__,
                             *(ActivationParams **)((long)&pIVar11->ptr_ + lVar9));
                  bVar6 = Result::good(__return_storage_ptr__);
                  if (!bVar6) goto LAB_002a7334;
                  std::__cxx11::string::~string(local_c8);
                }
                Result::Result(__return_storage_ptr__);
              }
            }
          }
        }
      }
    }
  }
  else {
    std::operator+(&local_90,"GRU layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_90,
                   "\' has invalid weight/recursion matrix or bias fields. Field value types should match and should be either half or full precision"
                  );
    std::__cxx11::string::~string((string *)&local_90);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    std::__cxx11::string::~string((string *)&err);
  }
LAB_002a7334:
  std::_Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  ~_Vector_base(&weightTypeList.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               );
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden states
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "GRU", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "GRU", 5, 5, blobNameToRank));
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate weight matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate weight matrix"));

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "update gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "reset gate recursion matrix"));

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                                                  outSize, "GRU", layer.name(), "output gate recursion matrix"));

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "update gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "reset gate bias vector"));

        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                                                      "GRU", layer.name(), "output gate bias vector"));
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRecurrentActivationParams(activation));
    }
    return Result();
}